

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O1

CURLcode xfer_send(Curl_easy *data,char *buf,size_t blen,size_t hds_len,size_t *pnwritten)

{
  bufq *q;
  undefined1 *puVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  ulong size;
  size_t sVar5;
  long lVar6;
  
  *pnwritten = 0;
  lVar6 = (data->set).max_send_speed;
  sVar5 = lVar6 + hds_len;
  if ((long)(blen - hds_len) <= lVar6) {
    sVar5 = blen;
  }
  if (lVar6 == 0) {
    sVar5 = blen;
  }
  if (((data->req).field_0xd9 & 0x20) == 0) {
LAB_0014d5b9:
    _Var2 = false;
  }
  else {
    q = &(data->req).sendbuf;
    _Var2 = Curl_bufq_is_empty(q);
    if (!_Var2) {
      sVar4 = Curl_bufq_len(q);
      if (sVar4 != sVar5) goto LAB_0014d5b9;
    }
    _Var2 = true;
  }
  CVar3 = Curl_xfer_send(data,buf,sVar5,_Var2,pnwritten);
  if (CVar3 == CURLE_OK) {
    if ((_Var2 != false) && (sVar5 == *pnwritten)) {
      puVar1 = &(data->req).field_0xd9;
      *puVar1 = *puVar1 | 0x40;
    }
    size = *pnwritten;
    if (size != 0) {
      if (hds_len != 0) {
        if (hds_len <= size) {
          size = hds_len;
        }
        Curl_debug(data,CURLINFO_HEADER_OUT,buf,size);
      }
      sVar5 = *pnwritten - hds_len;
      if (hds_len <= *pnwritten && sVar5 != 0) {
        Curl_debug(data,CURLINFO_DATA_OUT,buf + hds_len,sVar5);
        lVar6 = sVar5 + (data->req).writebytecount;
        (data->req).writebytecount = lVar6;
        Curl_pgrsSetUploadCounter(data,lVar6);
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLcode xfer_send(struct Curl_easy *data,
                          const char *buf, size_t blen,
                          size_t hds_len, size_t *pnwritten)
{
  CURLcode result = CURLE_OK;
  bool eos = FALSE;

  *pnwritten = 0;
  DEBUGASSERT(hds_len <= blen);
#ifdef DEBUGBUILD
  {
    /* Allow debug builds to override this logic to force short initial
       sends */
    size_t body_len = blen - hds_len;
    char *p = getenv("CURL_SMALLREQSEND");
    if(p) {
      size_t body_small = (size_t)strtoul(p, NULL, 10);
      if(body_small && body_small < body_len)
        blen = hds_len + body_small;
    }
  }
#endif
  /* Make sure this does not send more body bytes than what the max send
     speed says. The headers do not count to the max speed. */
  if(data->set.max_send_speed) {
    size_t body_bytes = blen - hds_len;
    if((curl_off_t)body_bytes > data->set.max_send_speed)
      blen = hds_len + (size_t)data->set.max_send_speed;
  }

  if(data->req.eos_read &&
    (Curl_bufq_is_empty(&data->req.sendbuf) ||
     Curl_bufq_len(&data->req.sendbuf) == blen)) {
    DEBUGF(infof(data, "sending last upload chunk of %zu bytes", blen));
    eos = TRUE;
  }
  result = Curl_xfer_send(data, buf, blen, eos, pnwritten);
  if(!result) {
    if(eos && (blen == *pnwritten))
      data->req.eos_sent = TRUE;
    if(*pnwritten) {
      if(hds_len)
        Curl_debug(data, CURLINFO_HEADER_OUT, (char *)buf,
                   CURLMIN(hds_len, *pnwritten));
      if(*pnwritten > hds_len) {
        size_t body_len = *pnwritten - hds_len;
        Curl_debug(data, CURLINFO_DATA_OUT, (char *)buf + hds_len, body_len);
        data->req.writebytecount += body_len;
        Curl_pgrsSetUploadCounter(data, data->req.writebytecount);
      }
    }
  }
  return result;
}